

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string *input;
  string *psVar1;
  char *pcVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  pointer pbVar4;
  pointer pcVar5;
  char *__s;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  const_iterator ci;
  pointer pbVar9;
  string dest;
  string local_40;
  
  __s = cmLocalGenerator::GetCurrentBinaryDirectory(this->LocalGenerator);
  psVar1 = &this->TempDir;
  pcVar2 = (char *)(this->TempDir)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)__s);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::append((char *)psVar1);
  if ((this->super_cmInstallGenerator).Destination._M_string_length != 0) {
    std::__cxx11::string::append((char *)psVar1);
    pvVar3 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationTypes;
    pbVar9 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (pvVar3->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar9 == pbVar4) {
      uVar6 = (this->super_cmInstallGenerator).super_cmScriptGenerator.ConfigurationName.
              _M_string_length;
      uVar7 = 8;
      if (8 < uVar6) {
        uVar7 = uVar6;
      }
    }
    else {
      uVar7 = 8;
      do {
        if (uVar7 < pbVar9->_M_string_length) {
          uVar7 = pbVar9->_M_string_length;
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar4);
    }
    input = &(this->super_cmInstallGenerator).Destination;
    uVar6 = (this->TempDir)._M_string_length + (this->FileName)._M_string_length + uVar7 + 2;
    if ((uVar6 < 1000) &&
       (uVar7 = (this->super_cmInstallGenerator).Destination._M_string_length, uVar7 <= 1000 - uVar6
       )) {
      pcVar5 = (input->_M_dataplus)._M_p;
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar5,pcVar5 + uVar7);
      if (*local_40._M_dataplus._M_p == '/') {
        *local_40._M_dataplus._M_p = '_';
      }
      if (local_40._M_string_length != 0) {
        sVar8 = 0;
        do {
          if (local_40._M_dataplus._M_p[sVar8] == ':') {
            local_40._M_dataplus._M_p[sVar8] = '_';
          }
          sVar8 = sVar8 + 1;
        } while (local_40._M_string_length != sVar8);
      }
      cmsys::SystemTools::ReplaceString(&local_40,"../","__/");
      if (local_40._M_string_length != 0) {
        sVar8 = 0;
        do {
          if (local_40._M_dataplus._M_p[sVar8] == ' ') {
            local_40._M_dataplus._M_p[sVar8] = '_';
          }
          sVar8 = sVar8 + 1;
        } while (local_40._M_string_length != sVar8);
      }
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return;
      }
    }
    else {
      cmSystemTools::ComputeStringMD5(&local_40,input);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_40._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p == &local_40.field_2) {
        return;
      }
    }
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  // Choose a temporary directory in which to generate the import
  // files to be installed.
  this->TempDir = this->LocalGenerator->GetCurrentBinaryDirectory();
  this->TempDir += cmake::GetCMakeFilesDirectory();
  this->TempDir += "/Export";
  if (this->Destination.empty()) {
    return;
  }
  this->TempDir += "/";

  // Enforce a maximum length.
  bool useMD5 = false;
#if defined(_WIN32) || defined(__CYGWIN__)
  std::string::size_type const max_total_len = 250;
#else
  std::string::size_type const max_total_len = 1000;
#endif
  // Will generate files of the form "<temp-dir>/<base>-<config>.<ext>".
  std::string::size_type const len = this->TempDir.size() + 1 +
    this->FileName.size() + 1 + this->GetMaxConfigLength();
  if (len < max_total_len) {
    // Keep the total path length below the limit.
    std::string::size_type const max_len = max_total_len - len;
    if (this->Destination.size() > max_len) {
      useMD5 = true;
    }
  } else {
    useMD5 = true;
  }
  if (useMD5) {
    // Replace the destination path with a hash to keep it short.
    this->TempDir += cmSystemTools::ComputeStringMD5(this->Destination);
  } else {
    std::string dest = this->Destination;
    // Avoid unix full paths.
    if (dest[0] == '/') {
      dest[0] = '_';
    }
    // Avoid windows full paths by removing colons.
    std::replace(dest.begin(), dest.end(), ':', '_');
    // Avoid relative paths that go up the tree.
    cmSystemTools::ReplaceString(dest, "../", "__/");
    // Avoid spaces.
    std::replace(dest.begin(), dest.end(), ' ', '_');
    this->TempDir += dest;
  }
}